

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio.c
# Opt level: O0

uint32_t FAudioSourceVoice_Stop(FAudioSourceVoice *voice,uint32_t Flags,uint32_t OperationSet)

{
  code *pcVar1;
  int iVar2;
  uint32_t uVar3;
  int in_EDX;
  uint in_ESI;
  long *in_RDI;
  SDL_AssertState sdl_assert_state;
  uint32_t in_stack_ffffffffffffffd8;
  uint32_t in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  
  if ((in_EDX == 0) || (*(char *)(*in_RDI + 1) == '\0')) {
    do {
      if (*(int *)((long)in_RDI + 0xc) == 0) goto LAB_00128a8a;
      iVar2 = SDL_ReportAssertion(&FAudioSourceVoice_Stop::sdl_assert_data,"FAudioSourceVoice_Stop",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/FAudio.c"
                                  ,0x970);
    } while (iVar2 == 0);
    if (iVar2 == 1) {
      pcVar1 = (code *)swi(3);
      uVar3 = (*pcVar1)();
      return uVar3;
    }
LAB_00128a8a:
    if ((in_ESI & 0x20) == 0) {
      *(undefined1 *)(in_RDI + 0x23) = 0;
    }
    else {
      *(undefined1 *)(in_RDI + 0x23) = 2;
    }
  }
  else {
    FAudio_OPERATIONSET_QueueStop
              ((FAudioSourceVoice *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
               in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8);
  }
  return 0;
}

Assistant:

uint32_t FAudioSourceVoice_Stop(
	FAudioSourceVoice *voice,
	uint32_t Flags,
	uint32_t OperationSet
) {
	LOG_API_ENTER(voice->audio)

	if (OperationSet != FAUDIO_COMMIT_NOW && voice->audio->active)
	{
		FAudio_OPERATIONSET_QueueStop(
			voice,
			Flags,
			OperationSet
		);
		LOG_API_EXIT(voice->audio)
		return 0;
	}

	FAudio_assert(voice->type == FAUDIO_VOICE_SOURCE);

	if (Flags & FAUDIO_PLAY_TAILS)
	{
		voice->src.active = 2;
	}
	else
	{
		voice->src.active = 0;
	}
	LOG_API_EXIT(voice->audio)
	return 0;
}